

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TZDBTimeZoneNames::getMetaZoneDisplayName
          (TZDBTimeZoneNames *this,UnicodeString *mzID,UTimeZoneNameType type,UnicodeString *name)

{
  TZDBNames *pTVar1;
  UChar **ppUVar2;
  UErrorCode status;
  UErrorCode local_34;
  ConstChar16Ptr local_30 [3];
  
  icu_63::UnicodeString::setToBogus(name);
  if (0x1f < (ushort)(mzID->fUnion).fStackFields.fLengthAndFlags) {
    local_34 = U_ZERO_ERROR;
    pTVar1 = getMetaZoneNames(mzID,&local_34);
    if (((pTVar1 != (TZDBNames *)0x0) && (local_34 < U_ILLEGAL_ARGUMENT_ERROR)) &&
       (ppUVar2 = pTVar1->fNames, ppUVar2 != (UChar **)0x0)) {
      if (type != UTZNM_SHORT_STANDARD) {
        if (type != UTZNM_SHORT_DAYLIGHT) {
          return name;
        }
        ppUVar2 = ppUVar2 + 1;
      }
      local_30[0].p_ = *ppUVar2;
      if (local_30[0].p_ != (UChar *)0x0) {
        icu_63::UnicodeString::setTo(name,'\x01',local_30,-1);
      }
    }
  }
  return name;
}

Assistant:

UnicodeString&
TZDBTimeZoneNames::getMetaZoneDisplayName(const UnicodeString& mzID,
                                          UTimeZoneNameType type,
                                          UnicodeString& name) const {
    name.setToBogus();
    if (mzID.isEmpty()) {
        return name;
    }

    UErrorCode status = U_ZERO_ERROR;
    const TZDBNames *tzdbNames = TZDBTimeZoneNames::getMetaZoneNames(mzID, status);
    if (U_SUCCESS(status)) {
        if (tzdbNames != NULL) {
            const UChar *s = tzdbNames->getName(type);
            if (s != NULL) {
                name.setTo(TRUE, s, -1);
            }
        }
    }

    return name;
}